

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O3

void __thiscall helics::CommsInterface::CommsInterface(CommsInterface *this)

{
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  this->_vptr_CommsInterface = (_func_int **)&PTR__CommsInterface_0054cfb8;
  (this->rxStatus)._M_i = STARTUP;
  (this->rxTrigger).triggered._M_base._M_i = false;
  (this->rxTrigger).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rxTrigger).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rxTrigger).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->rxTrigger).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rxTrigger).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rxTrigger).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rxTrigger).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rxTrigger).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->rxTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->rxTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->rxTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  std::condition_variable::condition_variable(&(this->rxTrigger).cv_trigger);
  std::condition_variable::condition_variable(&(this->rxTrigger).cv_active);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->localTargetAddress)._M_dataplus._M_p = (pointer)&(this->localTargetAddress).field_2;
  (this->localTargetAddress)._M_string_length = 0;
  (this->localTargetAddress).field_2._M_local_buf[0] = '\0';
  (this->brokerTargetAddress)._M_dataplus._M_p = (pointer)&(this->brokerTargetAddress).field_2;
  (this->brokerTargetAddress)._M_string_length = 0;
  (this->brokerTargetAddress).field_2._M_local_buf[0] = '\0';
  (this->brokerName)._M_dataplus._M_p = (pointer)&(this->brokerName).field_2;
  (this->brokerName)._M_string_length = 0;
  (this->brokerName).field_2._M_local_buf[0] = '\0';
  (this->brokerInitString)._M_dataplus._M_p = (pointer)&(this->brokerInitString).field_2;
  (this->brokerInitString)._M_string_length = 0;
  (this->brokerInitString).field_2._M_local_buf[0] = '\0';
  (this->randomID)._M_dataplus._M_p = (pointer)&(this->randomID).field_2;
  (this->randomID)._M_string_length = 0;
  (this->randomID).field_2._M_local_buf[0] = '\0';
  (this->txStatus)._M_i = STARTUP;
  (this->txTrigger).triggered._M_base._M_i = false;
  (this->txTrigger).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->txTrigger).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->txTrigger).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->txTrigger).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->txTrigger).activeLock.super___mutex_base._M_mutex + 8) = 0;
  (this->txTrigger).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->txTrigger).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->txTrigger).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->txTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->txTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->txTrigger).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  std::condition_variable::condition_variable(&(this->txTrigger).cv_trigger);
  std::condition_variable::condition_variable(&(this->txTrigger).cv_active);
  this->operating = (__atomic_base<bool>)0x0;
  this->singleThread = false;
  this->mRequireBrokerConnection = false;
  this->serverMode = true;
  this->autoBroker = false;
  this->useJsonSerialization = false;
  this->observer = false;
  (this->connectionTimeout).__r = 4000;
  this->maxMessageSize = 0x4000;
  this->maxMessageCount = 0x200;
  (this->requestDisconnect)._M_base._M_i = false;
  *(undefined8 *)&(this->ActionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ActionCallback).super__Function_base._M_functor + 8) = 0;
  (this->ActionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ActionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->loggingCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->loggingCallback).super__Function_base._M_functor + 8) = 0;
  (this->loggingCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->loggingCallback)._M_invoker = (_Invoker_type)0x0;
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::BlockingPriorityQueue(&this->txQueue);
  this->disconnecting = (__atomic_base<bool>)0x0;
  this->interfaceNetwork = LOCAL;
  (this->queue_transmitter)._M_id._M_thread = 0;
  (this->queue_watcher)._M_id._M_thread = 0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->threadSyncLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->threadSyncLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  gmlc::concurrency::TripWire::getLine();
  (this->tripDetector).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  (this->tripDetector).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_40;
  return;
}

Assistant:

CommsInterface() = default;